

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O0

bool Js::LineOffsetCache::FindNextLine
               (LPCUTF8 *currentSourcePosition,LPCUTF8 sourceEndCharacter,
               charcount_t *inOutCharacterOffset,charcount_t *inOutByteOffset,
               charcount_t maxCharacterOffset)

{
  undefined8 uVar1;
  bool bVar2;
  char16 cVar3;
  uint uVar4;
  bool wasLineEncountered;
  char16 decodedCharacter;
  LPCUTF8 previousCharacter;
  DecodeOptions options;
  charcount_t currentByteOffset;
  charcount_t currentCharacterOffset;
  charcount_t maxCharacterOffset_local;
  charcount_t *inOutByteOffset_local;
  charcount_t *inOutCharacterOffset_local;
  LPCUTF8 sourceEndCharacter_local;
  LPCUTF8 *currentSourcePosition_local;
  
  options = *inOutCharacterOffset;
  previousCharacter._4_4_ = *inOutByteOffset;
  previousCharacter._0_4_ = 1;
  currentByteOffset = maxCharacterOffset;
  _currentCharacterOffset = inOutByteOffset;
  inOutByteOffset_local = inOutCharacterOffset;
  inOutCharacterOffset_local = (charcount_t *)sourceEndCharacter;
  sourceEndCharacter_local = (LPCUTF8)currentSourcePosition;
  do {
    if (inOutCharacterOffset_local <= *(charcount_t **)sourceEndCharacter_local) {
      return false;
    }
    uVar1 = *(undefined8 *)sourceEndCharacter_local;
    cVar3 = utf8::Decode((LPCUTF8 *)sourceEndCharacter_local,(LPCUTF8)inOutCharacterOffset_local,
                         (DecodeOptions *)&previousCharacter,(bool *)0x0);
    bVar2 = false;
    uVar4 = (uint)(ushort)cVar3;
    if (uVar4 == 10) {
LAB_00a518fd:
      bVar2 = true;
    }
    else {
      if (uVar4 == 0xd) {
        if (**(char **)sourceEndCharacter_local == '\n') {
          *(long *)sourceEndCharacter_local = *(long *)sourceEndCharacter_local + 1;
          options = options + doAllowThreeByteSurrogates;
        }
        goto LAB_00a518fd;
      }
      if (uVar4 - 0x2028 < 2) goto LAB_00a518fd;
    }
    options = options + doAllowThreeByteSurrogates;
    previousCharacter._4_4_ =
         ((int)*(undefined8 *)sourceEndCharacter_local - (int)uVar1) + previousCharacter._4_4_;
    if (bVar2) {
      *inOutByteOffset_local = options;
      *_currentCharacterOffset = previousCharacter._4_4_;
      return true;
    }
    if (currentByteOffset <= options) {
      return false;
    }
  } while( true );
}

Assistant:

bool LineOffsetCache::FindNextLine(_In_z_ LPCUTF8 &currentSourcePosition, _In_z_ LPCUTF8 sourceEndCharacter, charcount_t &inOutCharacterOffset, charcount_t &inOutByteOffset, charcount_t maxCharacterOffset)
    {
        charcount_t currentCharacterOffset = inOutCharacterOffset;
        charcount_t currentByteOffset = inOutByteOffset;
        utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

        while (currentSourcePosition < sourceEndCharacter)
        {
            LPCUTF8 previousCharacter = currentSourcePosition;

            // Decode from UTF8 to wide char.  Note that Decode will advance the current character by 1 at least.
            char16 decodedCharacter = utf8::Decode(currentSourcePosition, sourceEndCharacter, options);

            bool wasLineEncountered = false;
            switch (decodedCharacter)
            {
            case _u('\r'):
                // Check if the next character is a '\n'.  If so, consume that character as well
                // (consider as one line).
                if (*currentSourcePosition == '\n')
                {
                    ++currentSourcePosition;
                    ++currentCharacterOffset;
                }

                // Intentional fall-through.
            case _u('\n'):
            case 0x2028:
            case 0x2029:
                // Found a new line.
                wasLineEncountered = true;
                break;
            }

            // Move to the next character offset.
            ++currentCharacterOffset;

            // Count the current byte offset we're at in the UTF-8 buffer.
            // The character size can be > 1 for unicode characters.
            currentByteOffset += static_cast<int>(currentSourcePosition - previousCharacter);

            if (wasLineEncountered)
            {
                inOutCharacterOffset = currentCharacterOffset;
                inOutByteOffset = currentByteOffset;
                return true;
            }
            else if (currentCharacterOffset >= maxCharacterOffset)
            {
                return false;
            }
        }

        return false;
    }